

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

bool __thiscall despot::util::tinyxml::TiXmlPrinter::Visit(TiXmlPrinter *this,TiXmlText *text)

{
  TiXmlString *this_00;
  Rep *pRVar1;
  size_t len;
  char *__s;
  TiXmlString str;
  TiXmlString local_20;
  
  if (text->cdata == true) {
    DoIndent(this);
    this_00 = &this->buffer;
    TiXmlString::append(this_00,"<![CDATA[",9);
    __s = ((text->super_TiXmlNode).value.rep_)->str;
    len = strlen(__s);
    TiXmlString::append(this_00,__s,len);
    TiXmlString::append(this_00,"]]>",3);
    pRVar1 = (this->lineBreak).rep_;
    TiXmlString::append(this_00,pRVar1->str,pRVar1->size);
  }
  else {
    if (this->simpleTextPrint == true) {
      local_20.rep_ = (Rep *)&TiXmlString::nullrep_;
      TiXmlBase::EncodeString(&(text->super_TiXmlNode).value,&local_20);
      TiXmlString::append(&this->buffer,(local_20.rep_)->str,(local_20.rep_)->size);
    }
    else {
      DoIndent(this);
      local_20.rep_ = (Rep *)&TiXmlString::nullrep_;
      TiXmlBase::EncodeString(&(text->super_TiXmlNode).value,&local_20);
      TiXmlString::append(&this->buffer,(local_20.rep_)->str,(local_20.rep_)->size);
      pRVar1 = (this->lineBreak).rep_;
      TiXmlString::append(&this->buffer,pRVar1->str,pRVar1->size);
    }
    if (local_20.rep_ != (Rep *)0x0 && local_20.rep_ != (Rep *)&TiXmlString::nullrep_) {
      operator_delete__(local_20.rep_);
    }
  }
  return true;
}

Assistant:

bool TiXmlPrinter::Visit(const TiXmlText& text) {
	if (text.CDATA()) {
		DoIndent();
		buffer += "<![CDATA[";
		buffer += text.Value();
		buffer += "]]>";
		DoLineBreak();
	} else if (simpleTextPrint) {
		TIXML_STRING str;
		TiXmlBase::EncodeString(text.ValueTStr(), &str);
		buffer += str;
	} else {
		DoIndent();
		TIXML_STRING str;
		TiXmlBase::EncodeString(text.ValueTStr(), &str);
		buffer += str;
		DoLineBreak();
	}
	return true;
}